

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O3

bool __thiscall test_case::eval_perf(test_case *this,ggml_backend_t backend,char *op_name)

{
  long *plVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  size_t sVar13;
  uint uVar14;
  ulong uVar15;
  ulong extraout_RDX;
  char *pcVar16;
  ulong uVar17;
  FILE *__stream;
  bool bVar18;
  uint uVar19;
  undefined8 in_R8;
  undefined8 in_R9;
  int i_1;
  long lVar20;
  int i;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ggml_context_ptr ctx;
  ggml_backend_buffer_ptr buf;
  undefined4 uVar25;
  undefined4 uVar26;
  _Head_base<0UL,_ggml_context_*,_false> local_1b0;
  long local_1a8;
  _Head_base<0UL,_ggml_backend_buffer_*,_false> local_1a0;
  long *local_198 [2];
  long local_188 [2];
  ulong local_178;
  long local_170;
  undefined8 uStack_168;
  undefined1 local_160;
  undefined7 uStack_15f;
  long *local_158 [2];
  long local_148 [2];
  long *local_138 [2];
  long local_128 [31];
  ulong uVar9;
  
  this->mode = MODE_PERF;
  lVar6 = ggml_tensor_overhead();
  local_170 = ggml_graph_overhead_custom(0x2000,0);
  local_170 = local_170 + lVar6 * 0x80;
  uStack_168 = 0;
  local_160 = 1;
  uVar7 = CONCAT71(uStack_15f,1);
  uStack_168._0_4_ = 0;
  uVar25 = (undefined4)local_170;
  uVar26 = (undefined4)uStack_168;
  local_1b0._M_head_impl = (ggml_context *)ggml_init();
  if (local_1b0._M_head_impl == (ggml_context *)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-backend-ops.cpp"
               ,0x25f,"GGML_ASSERT(%s) failed","ctx",in_R8,in_R9,uVar25,uVar26,uVar7);
  }
  iVar3 = (*this->_vptr_test_case[4])(this,local_1b0._M_head_impl);
  lVar6 = CONCAT44(extraout_var,iVar3);
  if (op_name != (char *)0x0) {
    (*this->_vptr_test_case[2])(local_138,this,lVar6);
    iVar3 = std::__cxx11::string::compare((char *)local_138);
    if (local_138[0] != local_128) {
      operator_delete(local_138[0],local_128[0] + 1);
    }
    bVar18 = true;
    if (iVar3 != 0) goto LAB_00129a37;
  }
  (*this->_vptr_test_case[2])(local_138,this,lVar6);
  plVar1 = local_138[0];
  (*this->_vptr_test_case[3])(local_198,this);
  iVar3 = printf("  %s(%s): ",plVar1,local_198[0]);
  if (local_198[0] != local_188) {
    operator_delete(local_198[0],local_188[0] + 1);
  }
  if (local_138[0] != local_128) {
    operator_delete(local_138[0],local_128[0] + 1);
  }
  fflush(_stdout);
  cVar2 = ggml_backend_supports_op(backend,lVar6);
  if (cVar2 == '\0') {
    puts("not supported");
    bVar18 = true;
  }
  else {
    uVar14 = iVar3 + 0xe;
    if (-1 < (int)(iVar3 + 7U)) {
      uVar14 = iVar3 + 7U;
    }
    uVar14 = uVar14 & 0xfffffff8;
    uVar19 = uVar14 + 8;
    if (4 < (int)(uVar14 - iVar3)) {
      uVar19 = uVar14;
    }
    printf("%*s",(ulong)(uVar19 - iVar3),"");
    local_1a0._M_head_impl =
         (ggml_backend_buffer *)ggml_backend_alloc_ctx_tensors(local_1b0._M_head_impl,backend);
    if (local_1a0._M_head_impl == (ggml_backend_buffer *)0x0) {
      puts("failed to allocate tensors");
      bVar18 = false;
    }
    else {
      (*this->_vptr_test_case[0xb])(this,local_1b0._M_head_impl);
      uVar7 = ggml_new_graph_custom(local_1b0._M_head_impl,0x2000,0);
      ggml_build_forward_expand(uVar7,lVar6);
      iVar3 = ggml_backend_graph_compute(backend,uVar7);
      __stream = _stderr;
      if (iVar3 == 0) {
        uVar8 = ggml_backend_get_device(backend);
        iVar3 = ggml_backend_dev_type(uVar8);
        iVar4 = (*this->_vptr_test_case[0xd])(this,lVar6);
        if (CONCAT44(extraout_var_00,iVar4) == 0) {
          uVar17 = 0x800000000;
          if (iVar3 == 0) {
            uVar17 = 0x200000000;
          }
          iVar3 = ggml_graph_size(uVar7);
          iVar4 = ggml_graph_n_nodes(uVar7);
          iVar5 = (*this->_vptr_test_case[0xc])(this,lVar6);
          uVar9 = CONCAT44(extraout_var_02,iVar5);
        }
        else {
          uVar17 = 100000000000;
          if (iVar3 == 0) {
            uVar17 = 8000000000;
          }
          iVar3 = ggml_graph_size(uVar7);
          iVar4 = ggml_graph_n_nodes(uVar7);
          iVar5 = (*this->_vptr_test_case[0xd])(this,lVar6);
          uVar9 = CONCAT44(extraout_var_01,iVar5);
        }
        uVar15 = uVar17 % uVar9;
        iVar5 = (int)(uVar17 / uVar9);
        if (iVar3 - iVar4 < iVar5) {
          iVar5 = iVar3 - iVar4;
        }
        iVar3 = iVar5;
        if (0 < iVar5) {
          do {
            ggml_graph_add_node(uVar7,lVar6,uVar15);
            iVar3 = iVar3 + -1;
            uVar15 = extraout_RDX;
          } while (iVar3 != 0);
        }
        iVar3 = (*this->_vptr_test_case[0xc])(this,lVar6);
        local_178 = (ulong)(iVar5 + 1U);
        local_1a8 = CONCAT44(extraout_var_03,iVar3) * (long)(int)(iVar5 + 1U);
        for (iVar3 = 0; iVar4 = ggml_graph_n_nodes(uVar7), iVar3 < iVar4; iVar3 = iVar3 + 1) {
          lVar10 = ggml_graph_node(uVar7,iVar3);
          if ((3 < *(int *)(lVar10 + 0x50) - 0x22U) &&
             (lVar10 = ggml_graph_node(uVar7,iVar3), lVar10 != lVar6)) {
            lVar10 = ggml_graph_node(uVar7,iVar3);
            lVar11 = ggml_nbytes(lVar10);
            lVar20 = 0;
            do {
              if (*(long *)(lVar10 + 0x98 + lVar20 * 8) != 0) {
                lVar12 = ggml_nbytes();
                lVar11 = lVar11 + lVar12;
              }
              lVar20 = lVar20 + 1;
            } while (lVar20 != 10);
            local_1a8 = local_1a8 + lVar11;
          }
        }
        lVar10 = 0;
        lVar11 = 0;
        uVar14 = 0;
        do {
          lVar20 = ggml_time_us();
          iVar3 = ggml_backend_graph_compute(backend,uVar7);
          __stream = _stderr;
          if (iVar3 != 0) {
            uVar7 = ggml_status_to_string(iVar3);
            goto LAB_00129a79;
          }
          lVar12 = ggml_time_us();
          lVar10 = lVar10 + (lVar12 - lVar20);
          lVar11 = lVar11 + local_1a8;
          uVar14 = uVar14 + (int)local_178;
        } while (lVar10 < 1000000);
        dVar22 = (double)lVar10;
        printf("    %8d runs - %8.2f us/run - ",SUB84(dVar22 / (double)(int)uVar14,0),(ulong)uVar14)
        ;
        iVar3 = (*this->_vptr_test_case[0xd])(this,lVar6);
        if (CONCAT44(extraout_var_04,iVar3) == 0) {
          iVar3 = (*this->_vptr_test_case[0xc])(this,lVar6);
          printf("%8zu kB/run - \x1b[1;34m%7.2f GB/s\x1b[0m",
                 SUB84(((double)lVar11 / (dVar22 / 1000000.0)) * 0.0009765625 * 0.0009765625 *
                       0.0009765625,0),CONCAT44(extraout_var_07,iVar3) >> 10);
        }
        else {
          iVar3 = (*this->_vptr_test_case[0xd])(this,lVar6);
          iVar4 = (*this->_vptr_test_case[0xd])(this,lVar6);
          uVar17 = CONCAT44(extraout_var_06,iVar4);
          auVar23._8_4_ = extraout_var_06;
          auVar23._0_8_ = uVar17;
          auVar23._12_4_ = 0x45300000;
          if (uVar17 >> 0xc < 0xe8d4a51) {
            if (uVar17 < 1000000000) {
              dVar21 = *(double *)(&DAT_001661f0 + (ulong)(uVar17 < 1000000) * 8);
              pcVar16 = "%6.2f MFLOP";
              if (uVar17 < 1000000) {
                pcVar16 = "%6.2f KFLOP";
              }
            }
            else {
              pcVar16 = "%6.2f GFLOP";
              dVar21 = 1000000000.0;
            }
          }
          else {
            pcVar16 = "%6.2f TFLOP";
            dVar21 = 1000000000000.0;
          }
          snprintf((char *)local_138,0x100,pcVar16,
                   SUB84(((auVar23._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,iVar4) - 4503599627370496.0)) / dVar21,0));
          local_198[0] = local_188;
          sVar13 = strlen((char *)local_138);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_198,local_138,(long)local_138 + sVar13);
          plVar1 = local_198[0];
          lVar6 = CONCAT44(extraout_var_05,iVar3) * (long)(int)uVar14;
          auVar24._8_4_ = (int)((ulong)lVar6 >> 0x20);
          auVar24._0_8_ = lVar6;
          auVar24._12_4_ = 0x45300000;
          dVar21 = ((auVar24._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) /
                   (dVar22 / 1000000.0);
          dVar22 = 1000000000000.0;
          if (1000000000000.0 <= dVar21) {
            pcVar16 = "%6.2f TFLOP";
          }
          else {
            dVar22 = 1000000000.0;
            if (1000000000.0 <= dVar21) {
              pcVar16 = "%6.2f GFLOP";
            }
            else {
              dVar22 = *(double *)(&DAT_001661f0 + (ulong)(dVar21 < 1000000.0) * 8);
              pcVar16 = "%6.2f MFLOP";
              if (dVar21 < 1000000.0) {
                pcVar16 = "%6.2f KFLOP";
              }
            }
          }
          snprintf((char *)local_138,0x100,pcVar16,SUB84(dVar21 / dVar22,0));
          local_158[0] = local_148;
          sVar13 = strlen((char *)local_138);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_158,local_138,(long)local_138 + sVar13);
          printf("%s/run - \x1b[1;34m%sS\x1b[0m",plVar1,local_158[0]);
          if (local_158[0] != local_148) {
            operator_delete(local_158[0],local_148[0] + 1);
          }
          if (local_198[0] != local_188) {
            operator_delete(local_198[0],local_188[0] + 1);
          }
        }
        putchar(10);
        bVar18 = true;
      }
      else {
        uVar7 = ggml_status_to_string(iVar3);
LAB_00129a79:
        bVar18 = false;
        fprintf(__stream,"%s: ggml_backend_graph_compute failed. status=%s \n","eval_perf",uVar7);
      }
    }
    std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>::~unique_ptr
              ((unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)&local_1a0);
  }
LAB_00129a37:
  std::unique_ptr<ggml_context,_ggml_context_deleter>::~unique_ptr
            ((unique_ptr<ggml_context,_ggml_context_deleter> *)&local_1b0);
  return bVar18;
}

Assistant:

bool eval_perf(ggml_backend_t backend, const char * op_name) {
        mode = MODE_PERF;

        static const size_t graph_nodes = 8192;

        ggml_init_params params = {
            /* .mem_size = */ ggml_tensor_overhead()*128 + ggml_graph_overhead_custom(graph_nodes, false),
            /* .mem_base = */ NULL,
            /* .no_alloc = */ true,
        };
        ggml_context_ptr ctx(ggml_init(params)); // smart ptr
        GGML_ASSERT(ctx);

        ggml_tensor * out = build_graph(ctx.get());

        if (op_name != nullptr && op_desc(out) != op_name) {
            //printf("  %s: skipping\n", op_desc(out).c_str());
            return true;
        }

        int len = printf("  %s(%s): ", op_desc(out).c_str(), vars().c_str());
        fflush(stdout);

        // check if backends support op
        if (!ggml_backend_supports_op(backend, out)) {
            printf("not supported\n");
            return true;
        }

        // align while also leaving some margin for variations in parameters
        int align = 8;
        int last = (len + align - 1) / align * align;
        if (last - len < 5) {
            last += align;
        }
        printf("%*s", last - len, "");

        // allocate
        ggml_backend_buffer_ptr buf(ggml_backend_alloc_ctx_tensors(ctx.get(), backend)); // smart ptr

        if (buf == NULL) {
            printf("failed to allocate tensors\n");
            return false;
        }

        // randomize tensors
        initialize_tensors(ctx.get());

        // build graph
        ggml_cgraph * gf = ggml_new_graph_custom(ctx.get(), graph_nodes, false);
        ggml_build_forward_expand(gf, out);

        // warmup run
        ggml_status status = ggml_backend_graph_compute(backend, gf);
        if (status != GGML_STATUS_SUCCESS) {
            fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
            return false;
        }

        // determine number of runs
        int n_runs;
        bool is_cpu = ggml_backend_dev_type(ggml_backend_get_device(backend)) == GGML_BACKEND_DEVICE_TYPE_CPU;
        if (op_flops(out) > 0) {
            // based on flops
            const uint64_t GFLOP = 1000 * 1000 * 1000;
            const uint64_t target_flops_cpu =   8ULL * GFLOP;
            const uint64_t target_flops_gpu = 100ULL * GFLOP;
            uint64_t target_flops = is_cpu ? target_flops_cpu : target_flops_gpu;
            n_runs = std::min<int>(ggml_graph_size(gf) - ggml_graph_n_nodes(gf), target_flops / op_flops(out)) + 1;
        } else {
            // based on memory size
            const size_t GB = 1ULL << 30;
            const size_t target_size_cpu =  8 * GB;
            const size_t target_size_gpu = 32 * GB;
            size_t target_size = is_cpu ? target_size_cpu : target_size_gpu;
            n_runs = std::min<int>(ggml_graph_size(gf) - ggml_graph_n_nodes(gf), target_size / op_size(out)) + 1;
        }

        // duplicate the op
        for (int i = 1; i < n_runs; i++) {
            ggml_graph_add_node(gf, out);
        }

        // calculate memory
        size_t mem = n_runs * op_size(out);
        auto tensor_op_size = [](ggml_tensor * t) {
            size_t size = ggml_nbytes(t);
            // add source tensors
            for (int i = 0; i < GGML_MAX_SRC; i++) {
                if (t->src[i] != NULL) {
                    size += ggml_nbytes(t->src[i]);
                }
            }
            return size;
        };
        for (int i = 0; i < ggml_graph_n_nodes(gf); ++i) {
            if (ggml_is_view_op(ggml_graph_node(gf, i)->op) || ggml_graph_node(gf, i) == out) {
                continue;
            }
            mem += tensor_op_size(ggml_graph_node(gf, i));
        }

        // run
        int64_t total_time_us = 0;
        int64_t total_mem = 0;
        int total_runs = 0;
        do {
            int64_t start_time = ggml_time_us();
            ggml_status status = ggml_backend_graph_compute(backend, gf);
            if (status != GGML_STATUS_SUCCESS) {
                fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
                return false;
            }
            int64_t end_time = ggml_time_us();

            total_time_us += end_time - start_time;
            total_mem += mem;
            total_runs += n_runs;
        } while (total_time_us < 1000*1000); // run for at least 1 second

        printf("    %8d runs - %8.2f us/run - ",
            total_runs,
            (double)total_time_us / total_runs);

        if (op_flops(out) > 0) {
            double flops_per_sec = (op_flops(out) * total_runs) / (total_time_us / 1e6);
            auto format_flops = [](double flops) -> std::string {
                char buf[256];
                if (flops >= 1e12) {
                    snprintf(buf, sizeof(buf), "%6.2f TFLOP", flops / 1e12);
                } else if (flops >= 1e9) {
                    snprintf(buf, sizeof(buf), "%6.2f GFLOP", flops / 1e9);
                } else if (flops >= 1e6) {
                    snprintf(buf, sizeof(buf), "%6.2f MFLOP", flops / 1e6);
                } else {
                    snprintf(buf, sizeof(buf), "%6.2f KFLOP", flops / 1e3);
                }
                return buf;
            };
            printf("%s/run - \033[1;34m%sS\033[0m",
                format_flops(op_flops(out)).c_str(),
                format_flops(flops_per_sec).c_str());

        } else {
            printf("%8zu kB/run - \033[1;34m%7.2f GB/s\033[0m",
                op_size(out) / 1024,
                total_mem / (total_time_us / 1e6) / 1024.0 / 1024.0 / 1024.0);
        }
        printf("\n");

        return true;
    }